

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilderCmd.cpp
# Opt level: O0

int cmdline_parser_file_save(char *filename,gengetopt_args_info *args_info)

{
  gengetopt_args_info *args_info_00;
  FILE *in_RSI;
  char *in_RDI;
  int i;
  FILE *outfile;
  int local_4;
  
  args_info_00 = (gengetopt_args_info *)fopen(in_RDI,"w");
  if (args_info_00 == (gengetopt_args_info *)0x0) {
    fprintf(_stderr,"%s: cannot open file for writing: %s\n","icosahedralBuilder",in_RDI);
    local_4 = 1;
  }
  else {
    local_4 = cmdline_parser_dump(in_RSI,args_info_00);
    fclose((FILE *)args_info_00);
  }
  return local_4;
}

Assistant:

int
cmdline_parser_file_save(const char *filename, struct gengetopt_args_info *args_info)
{
  FILE *outfile;
  int i = 0;

  outfile = fopen(filename, "w");

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot open file for writing: %s\n", CMDLINE_PARSER_PACKAGE, filename);
      return EXIT_FAILURE;
    }

  i = cmdline_parser_dump(outfile, args_info);
  fclose (outfile);

  return i;
}